

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *complexity)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  int iVar8;
  REF_INT cell;
  REF_NODE in_stack_ffffffffffffff18;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG ntet;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  *complexity = 0.0;
  uVar2 = ref_cell_ncell(ref_grid->cell[8],ref_node,&ntet);
  if (uVar2 == 0) {
    uVar2 = ref_cell_ncell(ref_grid->cell[9],ref_node,&npyr);
    if (uVar2 == 0) {
      uVar2 = ref_cell_ncell(ref_grid->cell[10],ref_node,&npri);
      if (uVar2 == 0) {
        uVar2 = ref_cell_ncell(ref_grid->cell[0xb],ref_node,&nhex);
        if (uVar2 == 0) {
          lVar4 = npyr + ntet + npri;
          lVar5 = lVar4 + nhex;
          if (lVar5 == 0 || SCARRY8(lVar4,nhex) != lVar5 < 0) {
            pRVar1 = ref_grid->cell[3];
            if (0 < pRVar1->max) {
              iVar8 = 0;
              do {
                RVar3 = ref_cell_nodes(pRVar1,iVar8,nodes);
                if ((RVar3 == 0) &&
                   (uVar2 = ref_metric_sub_tri_complexity
                                      (1,2,(REF_INT)nodes,(REF_INT *)metric,complexity,
                                       (REF_DBL *)ref_node,in_stack_ffffffffffffff18), uVar2 != 0))
                {
                  pcVar7 = "tri sub_tri";
                  uVar6 = 0x7a6;
                  goto LAB_001b04a9;
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < pRVar1->max);
            }
            pRVar1 = ref_grid->cell[6];
            if (0 < pRVar1->max) {
              iVar8 = 0;
              do {
                RVar3 = ref_cell_nodes(pRVar1,iVar8,nodes);
                if ((RVar3 == 0) &&
                   (uVar2 = ref_metric_sub_tri_complexity
                                      (1,2,(REF_INT)nodes,(REF_INT *)metric,complexity,
                                       (REF_DBL *)ref_node,in_stack_ffffffffffffff18), uVar2 != 0))
                {
                  pcVar7 = "qua sub_tri";
                  uVar6 = 0x7ad;
                  goto LAB_001b04a9;
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < pRVar1->max);
              if (0 < pRVar1->max) {
                iVar8 = 0;
                do {
                  RVar3 = ref_cell_nodes(pRVar1,iVar8,nodes);
                  if ((RVar3 == 0) &&
                     (uVar2 = ref_metric_sub_tri_complexity
                                        (2,3,(REF_INT)nodes,(REF_INT *)metric,complexity,
                                         (REF_DBL *)ref_node,in_stack_ffffffffffffff18), uVar2 != 0)
                     ) {
                    pcVar7 = "qua sub_tri";
                    uVar6 = 0x7b2;
                    goto LAB_001b04a9;
                  }
                  iVar8 = iVar8 + 1;
                } while (iVar8 < pRVar1->max);
              }
            }
          }
          else {
            pRVar1 = ref_grid->cell[8];
            if (0 < pRVar1->max) {
              iVar8 = 0;
              do {
                RVar3 = ref_cell_nodes(pRVar1,iVar8,nodes);
                if ((RVar3 == 0) &&
                   (uVar2 = ref_metric_sub_tet_complexity(0,1,2,3,nodes,metric,complexity,ref_node),
                   uVar2 != 0)) {
                  pcVar7 = "tet sub_tet";
                  uVar6 = 0x772;
                  goto LAB_001b04a9;
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < pRVar1->max);
            }
            pRVar1 = ref_grid->cell[9];
            if (0 < pRVar1->max) {
              iVar8 = 0;
              do {
                RVar3 = ref_cell_nodes(pRVar1,iVar8,nodes);
                if (RVar3 == 0) {
                  uVar2 = ref_metric_sub_tet_complexity(0,4,1,2,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "pyr sub_tet";
                    uVar6 = 0x779;
                    goto LAB_001b04a9;
                  }
                  uVar2 = ref_metric_sub_tet_complexity(0,3,4,2,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "pyr sub_tet";
                    uVar6 = 0x77c;
                    goto LAB_001b04a9;
                  }
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < pRVar1->max);
            }
            pRVar1 = ref_grid->cell[10];
            if (0 < pRVar1->max) {
              cell = 0;
              do {
                RVar3 = ref_cell_nodes(pRVar1,cell,nodes);
                if (RVar3 == 0) {
                  uVar2 = ref_metric_sub_tet_complexity(0,4,5,3,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "pri sub_tet";
                    uVar6 = 0x783;
                    goto LAB_001b04a9;
                  }
                  uVar2 = ref_metric_sub_tet_complexity(0,1,5,4,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "pri sub_tet";
                    uVar6 = 0x786;
                    goto LAB_001b04a9;
                  }
                  uVar2 = ref_metric_sub_tet_complexity(0,1,2,5,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "pri sub_tet";
                    uVar6 = 0x789;
                    goto LAB_001b04a9;
                  }
                }
                cell = cell + 1;
              } while (cell < pRVar1->max);
            }
            pRVar1 = ref_grid->cell[0xb];
            if (0 < pRVar1->max) {
              iVar8 = 0;
              do {
                RVar3 = ref_cell_nodes(pRVar1,iVar8,nodes);
                if (RVar3 == 0) {
                  uVar2 = ref_metric_sub_tet_complexity(0,5,7,4,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "hex sub_tet";
                    uVar6 = 0x790;
                    goto LAB_001b04a9;
                  }
                  uVar2 = ref_metric_sub_tet_complexity(0,1,7,5,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "hex sub_tet";
                    uVar6 = 0x793;
                    goto LAB_001b04a9;
                  }
                  uVar2 = ref_metric_sub_tet_complexity(1,6,7,5,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "hex sub_tet";
                    uVar6 = 0x796;
                    goto LAB_001b04a9;
                  }
                  uVar2 = ref_metric_sub_tet_complexity(0,7,2,3,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "hex sub_tet";
                    uVar6 = 0x799;
                    goto LAB_001b04a9;
                  }
                  uVar2 = ref_metric_sub_tet_complexity(0,7,1,2,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "hex sub_tet";
                    uVar6 = 0x79c;
                    goto LAB_001b04a9;
                  }
                  uVar2 = ref_metric_sub_tet_complexity(1,7,6,2,nodes,metric,complexity,ref_node);
                  if (uVar2 != 0) {
                    pcVar7 = "hex sub_tet";
                    uVar6 = 0x79f;
                    goto LAB_001b04a9;
                  }
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < pRVar1->max);
            }
          }
          uVar2 = ref_mpi_allsum(ref_grid->mpi,complexity,1,3);
          if (uVar2 == 0) {
            return 0;
          }
          pcVar7 = "dbl sum";
          uVar6 = 0x7b7;
        }
        else {
          pcVar7 = "count";
          uVar6 = 0x76b;
        }
      }
      else {
        pcVar7 = "count";
        uVar6 = 0x76a;
      }
    }
    else {
      pcVar7 = "count";
      uVar6 = 0x769;
    }
  }
  else {
    pcVar7 = "count";
    uVar6 = 0x768;
  }
LAB_001b04a9:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar6,
         "ref_metric_complexity",(ulong)uVar2,pcVar7);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_complexity(REF_DBL *metric, REF_GRID ref_grid,
                                         REF_DBL *complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL have_vol_cells;
  REF_LONG ntet, npyr, npri, nhex;
  *complexity = 0.0;
  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "count");
  RSS(ref_cell_ncell(ref_grid_pyr(ref_grid), ref_node, &npyr), "count");
  RSS(ref_cell_ncell(ref_grid_pri(ref_grid), ref_node, &npri), "count");
  RSS(ref_cell_ncell(ref_grid_hex(ref_grid), ref_node, &nhex), "count");
  have_vol_cells = (0 < ntet + npyr + npri + nhex);
  if (have_vol_cells) {
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 1, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "tet sub_tet");
    }

    ref_cell = ref_grid_pyr(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 4, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "pyr sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 3, 4, 2, nodes, metric, complexity,
                                        ref_node),
          "pyr sub_tet");
    }

    ref_cell = ref_grid_pri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 4, 5, 3, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 5, 4, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 2, 5, nodes, metric, complexity,
                                        ref_node),
          "pri sub_tet");
    }

    ref_cell = ref_grid_hex(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tet_complexity(0, 5, 7, 4, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 1, 7, 5, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(1, 6, 7, 5, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 7, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(0, 7, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
      RSS(ref_metric_sub_tet_complexity(1, 7, 6, 2, nodes, metric, complexity,
                                        ref_node),
          "hex sub_tet");
    }
  } else {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "tri sub_tri");
    }

    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 1, 2, nodes, metric, complexity,
                                        ref_node),
          "qua sub_tri");
    }
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_metric_sub_tri_complexity(0, 2, 3, nodes, metric, complexity,
                                        ref_node),
          "qua sub_tri");
    }
  }

  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), complexity, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}